

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O2

void heapify_subtree(u32 *A,uint length,uint subtree_idx)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = A[subtree_idx];
  uVar3 = (ulong)subtree_idx;
  while( true ) {
    uVar2 = (int)uVar3 * 2;
    uVar4 = (ulong)uVar2;
    if (length < uVar2) break;
    if ((uVar2 < length) && (uVar4 = (ulong)(uVar2 | 1), A[uVar4] <= A[uVar2])) {
      uVar4 = (ulong)uVar2;
    }
    if (A[uVar4] <= uVar1) break;
    A[uVar3] = A[uVar4];
    uVar3 = uVar4;
  }
  A[uVar3] = uVar1;
  return;
}

Assistant:

void
heapify_subtree(u32 A[], unsigned length, unsigned subtree_idx)
{
	unsigned parent_idx;
	unsigned child_idx;
	u32 v;

	v = A[subtree_idx];
	parent_idx = subtree_idx;
	while ((child_idx = parent_idx * 2) <= length) {
		if (child_idx < length && A[child_idx + 1] > A[child_idx])
			child_idx++;
		if (v >= A[child_idx])
			break;
		A[parent_idx] = A[child_idx];
		parent_idx = child_idx;
	}
	A[parent_idx] = v;
}